

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTableSet(PrintExpressionContents *this,TableSet *curr)

{
  ostream *o;
  string_view local_28;
  TableSet *local_18;
  TableSet *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (TableSet *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"table.set ");
  printMedium(o,local_28);
  wasm::Name::print(&local_18->table,this->o);
  return;
}

Assistant:

void visitTableSet(TableSet* curr) {
    printMedium(o, "table.set ");
    curr->table.print(o);
  }